

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<long,_unsigned_long,_13>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int64_t *lhs,uint64_t *rhs,long *result)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  if (*in_RDI <= *in_RDI + *in_RSI) {
    *in_RDX = *in_RDI + *in_RSI;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const std::int64_t& lhs, const std::uint64_t& rhs, T& result ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits< T >::isInt64 && safeint_internal::int_traits< U >::isUint64, "T must be Int64, U Uint64");
        // rhs is std::uint64_t, lhs std::int64_t
        std::uint64_t tmp = (std::uint64_t)lhs + rhs;

        if( (std::int64_t)tmp >= lhs )
        {
            result = (std::int64_t)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }